

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall
spv::Builder::makeSwitch
          (Builder *this,Id selector,uint control,int numSegments,
          vector<int,_std::allocator<int>_> *caseValues,
          vector<int,_std::allocator<int>_> *valueIndexToSegment,int defaultSegment,
          vector<spv::Block_*,_std::allocator<spv::Block_*>_> *segmentBlocks)

{
  Function *parent;
  pointer piVar1;
  Block *pBVar2;
  Instruction *this_00;
  pointer ppBVar3;
  int i;
  long lVar4;
  Id IVar5;
  int iVar6;
  bool bVar7;
  Block *mergeBlock;
  uint local_40;
  Id local_3c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  parent = this->buildPoint->parent;
  iVar6 = 0;
  local_40 = control;
  local_3c = selector;
  if (0 < numSegments) {
    iVar6 = numSegments;
  }
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    pBVar2 = (Block *)::operator_new(0x90);
    IVar5 = this->uniqueId + 1;
    this->uniqueId = IVar5;
    Block::Block(pBVar2,IVar5,parent);
    mergeBlock = pBVar2;
    std::vector<spv::Block*,std::allocator<spv::Block*>>::emplace_back<spv::Block*>
              ((vector<spv::Block*,std::allocator<spv::Block*>> *)segmentBlocks,&mergeBlock);
  }
  pBVar2 = (Block *)::operator_new(0x90);
  IVar5 = this->uniqueId + 1;
  this->uniqueId = IVar5;
  Block::Block(pBVar2,IVar5,parent);
  mergeBlock = pBVar2;
  createSelectionMerge(this,pBVar2,local_40);
  this_00 = (Instruction *)::operator_new(0x60);
  this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_00a5fd48;
  this_00->resultId = 0;
  this_00->typeId = 0;
  this_00->opCode = OpSwitch;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_00->block = (Block *)0x0;
  Instruction::reserveOperands
            (this_00,((long)(caseValues->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(caseValues->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 1) + 2);
  Instruction::addIdOperand(this_00,local_3c);
  ppBVar3 = (segmentBlocks->super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>)._M_impl
            .super__Vector_impl_data._M_start + (uint)defaultSegment;
  if (defaultSegment < 0) {
    ppBVar3 = &mergeBlock;
  }
  pBVar2 = *ppBVar3;
  Instruction::addIdOperand
            (this_00,*(Id *)((long)(((pBVar2->instructions).
                                     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                   ._M_t + 8));
  Block::addPredecessor(pBVar2,this->buildPoint);
  for (lVar4 = 0;
      piVar1 = (caseValues->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      lVar4 < (int)((ulong)((long)(caseValues->super__Vector_base<int,_std::allocator<int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
      lVar4 = lVar4 + 1) {
    Instruction::addImmediateOperand(this_00,piVar1[lVar4]);
    Instruction::addIdOperand
              (this_00,*(Id *)(**(long **)&((segmentBlocks->
                                            super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>
                                            )._M_impl.super__Vector_impl_data._M_start
                                            [(valueIndexToSegment->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_start[lVar4]]->instructions)
                                           .
                                           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                           ._M_impl.super__Vector_impl_data + 8));
    Block::addPredecessor
              ((segmentBlocks->super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>).
               _M_impl.super__Vector_impl_data._M_start
               [(valueIndexToSegment->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar4]],this->buildPoint);
  }
  local_38._M_head_impl = this_00;
  addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  std::deque<spv::Block_*,_std::allocator<spv::Block_*>_>::push_back
            (&(this->switchMerges).c,&mergeBlock);
  return;
}

Assistant:

void Builder::makeSwitch(Id selector, unsigned int control, int numSegments, const std::vector<int>& caseValues,
                         const std::vector<int>& valueIndexToSegment, int defaultSegment,
                         std::vector<Block*>& segmentBlocks)
{
    Function& function = buildPoint->getParent();

    // make all the blocks
    for (int s = 0; s < numSegments; ++s)
        segmentBlocks.push_back(new Block(getUniqueId(), function));

    Block* mergeBlock = new Block(getUniqueId(), function);

    // make and insert the switch's selection-merge instruction
    createSelectionMerge(mergeBlock, control);

    // make the switch instruction
    Instruction* switchInst = new Instruction(NoResult, NoType, OpSwitch);
    switchInst->reserveOperands((caseValues.size() * 2) + 2);
    switchInst->addIdOperand(selector);
    auto defaultOrMerge = (defaultSegment >= 0) ? segmentBlocks[defaultSegment] : mergeBlock;
    switchInst->addIdOperand(defaultOrMerge->getId());
    defaultOrMerge->addPredecessor(buildPoint);
    for (int i = 0; i < (int)caseValues.size(); ++i) {
        switchInst->addImmediateOperand(caseValues[i]);
        switchInst->addIdOperand(segmentBlocks[valueIndexToSegment[i]]->getId());
        segmentBlocks[valueIndexToSegment[i]]->addPredecessor(buildPoint);
    }
    addInstruction(std::unique_ptr<Instruction>(switchInst));

    // push the merge block
    switchMerges.push(mergeBlock);
}